

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O1

enable_if_t<std::is_base_of<_::acto::actor,_Listener>::value,_actor_ref> __thiscall
acto::spawn<Listener>(acto *this,actor_ref *context)

{
  Listener *this_00;
  object_t *an_object;
  _Head_base<0UL,_acto::actor_*,_false> local_20;
  actor_ref local_18;
  
  actor_ref::actor_ref(&local_18,context);
  this_00 = (Listener *)operator_new(0x60);
  Listener::Listener(this_00);
  local_20._M_head_impl = (actor *)this_00;
  an_object = core::make_instance(&local_18,shared,
                                  (unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *)
                                  &local_20);
  actor_ref::actor_ref((actor_ref *)this,an_object,false);
  if ((Listener *)local_20._M_head_impl != (Listener *)0x0) {
    (*((actor *)&(local_20._M_head_impl)->_vptr_actor)->_vptr_actor[1])();
  }
  local_20._M_head_impl = (actor *)0x0;
  actor_ref::~actor_ref(&local_18);
  return (enable_if_t<std::is_base_of<_::acto::actor,_Listener>::value,_actor_ref>)(object_t *)this;
}

Assistant:

inline std::enable_if_t<std::is_base_of<::acto::actor, T>::value, actor_ref>
spawn(actor_ref context, P&&... p) {
  return actor_ref(
    core::make_instance(std::move(context), actor_thread::shared,
                        std::make_unique<T>(std::forward<P>(p)...)),
    false);
}